

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O0

CWLDef * parseCWL(CWLDef *__return_storage_ptr__,string *path)

{
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string *path_local;
  CWLDef *data;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  *(undefined8 *)&(__return_storage_ptr__->snippets)._M_h._M_rehash_policy = 0;
  (__return_storage_ptr__->snippets)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->snippets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->snippets)._M_h._M_element_count = 0;
  (__return_storage_ptr__->snippets)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->snippets)._M_h._M_bucket_count = 0;
  (__return_storage_ptr__->snippets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<LConfig::LatexConfig::CWL::EnvKind,_std::vector<LConfig::LatexConfig::CWL::CWLSnippet,_std::allocator<LConfig::LatexConfig::CWL::CWLSnippet>_>,_std::hash<LConfig::LatexConfig::CWL::EnvKind>,_std::equal_to<LConfig::LatexConfig::CWL::EnvKind>,_std::allocator<std::pair<const_LConfig::LatexConfig::CWL::EnvKind,_std::vector<LConfig::LatexConfig::CWL::CWLSnippet,_std::allocator<LConfig::LatexConfig::CWL::CWLSnippet>_>_>_>_>
  ::unordered_map(&__return_storage_ptr__->snippets);
  *(undefined8 *)&(__return_storage_ptr__->environments)._M_h._M_rehash_policy = 0;
  (__return_storage_ptr__->environments)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->environments)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->environments)._M_h._M_element_count = 0;
  (__return_storage_ptr__->environments)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->environments)._M_h._M_bucket_count = 0;
  (__return_storage_ptr__->environments)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>_>_>
  ::unordered_map(&__return_storage_ptr__->environments);
  *(undefined8 *)&(__return_storage_ptr__->commands)._M_h._M_rehash_policy = 0;
  (__return_storage_ptr__->commands)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->commands)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->commands)._M_h._M_element_count = 0;
  (__return_storage_ptr__->commands)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->commands)._M_h._M_bucket_count = 0;
  (__return_storage_ptr__->commands)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::CommandKind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::CommandKind>_>_>
  ::unordered_map(&__return_storage_ptr__->commands);
  getFileContents((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,path);
  extractCommands((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38);
  processCommands(__return_storage_ptr__,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60);
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  if ((lines.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    LConfig::LatexConfig::CWL::CWLDef::~CWLDef(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

CWLDef parseCWL (const string &path) {
    CWLDef data {};
    auto lines = getFileContents(path);
    auto commands = extractCommands(lines);
    processCommands(data, commands);
    return data;
}